

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::anon_unknown_0::BasicDispatchIndirect::RunIteration
          (BasicDispatchIndirect *this,GLintptr offset,GLuint buffer_size)

{
  GLuint buffer;
  ulong __n;
  GLuint i;
  CallLogWrapper *this_00;
  ulong uVar1;
  allocator_type local_39;
  vector<unsigned_int,_std::allocator<unsigned_int>_> data;
  
  __n = (ulong)buffer_size;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&data,__n,&local_39);
  buffer = this->m_storage_buffer;
  if (buffer == 0) {
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->m_storage_buffer);
    buffer = this->m_storage_buffer;
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,buffer);
  glu::CallLogWrapper::glBufferData
            (this_00,0x90d2,__n * 4,
             data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e8);
  glu::CallLogWrapper::glDispatchComputeIndirect(this_00,offset);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
  glu::CallLogWrapper::glGetBufferSubData
            (this_00,0x90d2,0,__n * 4,
             data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  uVar1 = 0;
  do {
    if (__n == uVar1) {
LAB_009d011a:
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      return __n <= uVar1;
    }
    if (uVar1 != data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar1]) {
      anon_unknown_0::Output
                ("Data at index %d is %d should be %d.\n",uVar1 & 0xffffffff,
                 (ulong)data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                        .super__Vector_impl_data._M_start[uVar1],uVar1 & 0xffffffff);
      goto LAB_009d011a;
    }
    uVar1 = uVar1 + 1;
  } while( true );
}

Assistant:

bool RunIteration(GLintptr offset, GLuint buffer_size)
	{
		std::vector<GLuint> data(buffer_size);
		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(GLuint) * buffer_size, &data[0], GL_DYNAMIC_DRAW);

		glDispatchComputeIndirect(offset);

		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(GLuint) * buffer_size, &data[0]);
		for (GLuint i = 0; i < buffer_size; ++i)
		{
			if (data[i] != i)
			{
				Output("Data at index %d is %d should be %d.\n", i, data[i], i);
				return false;
			}
		}
		return true;
	}